

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O2

bool __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
::CheckDomainReturnFalseIfTrivial
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
           *this,PLPoints *result)

{
  double dVar1;
  int iVar2;
  Error *this_00;
  undefined4 extraout_var;
  double *in_R9;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator<char> local_f9;
  double local_f8;
  double local_f0;
  char *local_e8;
  undefined8 local_e0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  double local_c0;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Vector_base<double,_std::allocator<double>_> local_78;
  undefined1 local_58 [32];
  pointer pdStack_38;
  pointer local_30;
  
  local_f0 = this->lbx_;
  dVar1 = this->ubx_;
  if (local_f0 <= dVar1 + 1e-06) {
    local_f8 = dVar1 + -1e-06;
    if (local_f8 < local_f0) {
      local_98._M_dataplus._M_p = (pointer)((dVar1 + local_f0) * 0.5);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_98;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_d8,__l,
                 (allocator_type *)&local_e0);
      (*this->_vptr_BasicPLApproximator[9])((this->lbx_ + this->ubx_) * 0.5,this);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_b8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_78,__l_00,
                 (allocator_type *)&local_e8);
      local_58._0_8_ = local_d8._M_impl.super__Vector_impl_data._M_start;
      local_58._8_8_ = local_d8._M_impl.super__Vector_impl_data._M_finish;
      local_58._16_8_ = local_d8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58._24_8_ = local_78._M_impl.super__Vector_impl_data._M_start;
      pdStack_38 = local_78._M_impl.super__Vector_impl_data._M_finish;
      local_30 = local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PLPoints::operator=(result,(PLPoints *)local_58);
      PLPoints::~PLPoints((PLPoints *)local_58);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
    }
    return local_f0 <= local_f8;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Model infeasible: ",&local_f9);
  iVar2 = (*this->_vptr_BasicPLApproximator[2])(this);
  local_e0 = CONCAT44(extraout_var,iVar2);
  local_e8 = (char *)this->lbx_;
  local_c0 = this->ubx_;
  fmt::format<char_const*,double,double>
            (&local_b8,(fmt *)"PLApprox {}: empty argument domain [{}, {}]",(CStringRef)&local_e0,
             &local_e8,&local_c0,in_R9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_98,&local_b8);
  Error::Error(this_00,(CStringRef)local_58._0_8_,200);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

bool BasicPLApproximator<FuncCon>::CheckDomainReturnFalseIfTrivial(
    PLPoints& result) {
  if (lbx() > ubx()+1e-6)
    MP_INFEAS(fmt::format("PLApprox {}: "
                          "empty argument domain [{}, {}]",
                          GetConTypeName(), lbx(), ubx()));
  /// Domain ~ single point
  if (lbx() > ubx()-1e-6) {
    result = { {(lbx()+ubx())/2.0}, {eval((lbx()+ubx())/2.0)} };
    return false;
  }
  return true;
}